

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopsubdiv.cpp
# Opt level: O2

Point3f pbrt::weightBoundary(SDVertex *vert,Float beta)

{
  undefined1 auVar1 [16];
  int iVar2;
  Tuple3<pbrt::Point3,float> *pTVar3;
  Tuple3<pbrt::Point3,float> *pTVar4;
  Point3<float> PVar5;
  Point3<float> PVar6;
  Point3<float> PVar7;
  Point3f PVar8;
  InlinedVector<pbrt::Point3<float>,_16,_pstd::pmr::polymorphic_allocator<pbrt::Point3<float>_>_>
  pRing;
  float local_128;
  float fStack_124;
  float local_118;
  float fStack_114;
  polymorphic_allocator<pbrt::Point3<float>_> local_100;
  undefined1 local_f8 [224];
  
  iVar2 = SDVertex::valence(vert);
  local_100.memoryResource = pstd::pmr::new_delete_resource();
  InlinedVector<pbrt::Point3<float>,_16,_pstd::pmr::polymorphic_allocator<pbrt::Point3<float>_>_>::
  InlinedVector((InlinedVector<pbrt::Point3<float>,_16,_pstd::pmr::polymorphic_allocator<pbrt::Point3<float>_>_>
                 *)local_f8,(long)iVar2,&local_100);
  pTVar4 = (Tuple3<pbrt::Point3,float> *)(local_f8 + 0x10);
  pTVar3 = (Tuple3<pbrt::Point3,float> *)local_f8._8_8_;
  if ((Tuple3<pbrt::Point3,float> *)local_f8._8_8_ == (Tuple3<pbrt::Point3,float> *)0x0) {
    pTVar3 = pTVar4;
  }
  SDVertex::oneRing(vert,(Point3f *)pTVar3);
  auVar1 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),ZEXT416((uint)beta),ZEXT416(0x3f800000));
  PVar5 = Tuple3<pbrt::Point3,float>::operator*((Tuple3<pbrt::Point3,float> *)vert,auVar1._0_4_);
  pTVar3 = (Tuple3<pbrt::Point3,float> *)local_f8._8_8_;
  if ((Tuple3<pbrt::Point3,float> *)local_f8._8_8_ == (Tuple3<pbrt::Point3,float> *)0x0) {
    pTVar3 = pTVar4;
  }
  PVar6 = Tuple3<pbrt::Point3,float>::operator*(pTVar3,beta);
  if ((Tuple3<pbrt::Point3,float> *)local_f8._8_8_ != (Tuple3<pbrt::Point3,float> *)0x0) {
    pTVar4 = (Tuple3<pbrt::Point3,float> *)local_f8._8_8_;
  }
  PVar7 = Tuple3<pbrt::Point3,float>::operator*(pTVar4 + (long)iVar2 * 0xc + -0xc,beta);
  local_118 = PVar6.super_Tuple3<pbrt::Point3,_float>.x;
  fStack_114 = PVar6.super_Tuple3<pbrt::Point3,_float>.y;
  local_128 = PVar5.super_Tuple3<pbrt::Point3,_float>.x;
  fStack_124 = PVar5.super_Tuple3<pbrt::Point3,_float>.y;
  PVar8.super_Tuple3<pbrt::Point3,_float>.x =
       local_118 + local_128 + PVar7.super_Tuple3<pbrt::Point3,_float>.x;
  PVar8.super_Tuple3<pbrt::Point3,_float>.y =
       fStack_114 + fStack_124 + PVar7.super_Tuple3<pbrt::Point3,_float>.y;
  InlinedVector<pbrt::Point3<float>,_16,_pstd::pmr::polymorphic_allocator<pbrt::Point3<float>_>_>::
  ~InlinedVector((InlinedVector<pbrt::Point3<float>,_16,_pstd::pmr::polymorphic_allocator<pbrt::Point3<float>_>_>
                  *)local_f8);
  PVar8.super_Tuple3<pbrt::Point3,_float>.z =
       PVar6.super_Tuple3<pbrt::Point3,_float>.z + PVar5.super_Tuple3<pbrt::Point3,_float>.z +
       PVar7.super_Tuple3<pbrt::Point3,_float>.z;
  return (Point3f)PVar8.super_Tuple3<pbrt::Point3,_float>;
}

Assistant:

static Point3f weightBoundary(SDVertex *vert, Float beta) {
    // Put _vert_ one-ring in _pRing_
    int valence = vert->valence();
    InlinedVector<Point3f, 16> pRing(valence);

    vert->oneRing(pRing.data());
    Point3f p = (1 - 2 * beta) * vert->p;
    p += beta * pRing[0];
    p += beta * pRing[valence - 1];
    return p;
}